

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateTemplateNode::WriteHeaderEntries
          (TemplateTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  ulong uVar2;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *filename_local;
  string *outstring_local;
  TemplateTemplateNode *this_local;
  
  pcVar1 = (this->token_).text;
  uVar2 = (this->token_).textlen;
  local_20 = filename;
  filename_local = outstring;
  outstring_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,uVar2,&local_41);
  anon_unknown_14::WriteOneHeaderEntry(outstring,(string *)local_40,local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

virtual void WriteHeaderEntries(string *outstring,
                                  const string& filename) const {
    WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                        filename);
  }